

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::Stack<Kernel::TermSpec>::Stack(Stack<Kernel::TermSpec> *this,size_t initialCapacity)

{
  ulong uVar1;
  TermSpec *pTVar2;
  
  this->_capacity = initialCapacity;
  if (initialCapacity == 0) {
    pTVar2 = (TermSpec *)0x0;
  }
  else {
    uVar1 = initialCapacity << 4;
    if (uVar1 == 0) {
      pTVar2 = (TermSpec *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar1 < 0x11) {
      pTVar2 = (TermSpec *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar1 < 0x19) {
      pTVar2 = (TermSpec *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar1 < 0x21) {
      pTVar2 = (TermSpec *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar1 < 0x31) {
      pTVar2 = (TermSpec *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar1 < 0x41) {
      pTVar2 = (TermSpec *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      pTVar2 = (TermSpec *)::operator_new(uVar1,0x10);
    }
  }
  this->_stack = pTVar2;
  this->_cursor = pTVar2;
  this->_end = pTVar2 + this->_capacity;
  return;
}

Assistant:

inline
  explicit Stack (size_t initialCapacity=0)
    : _capacity(initialCapacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = nullptr;
    }
    _cursor = _stack;
    _end = _stack+_capacity;
  }